

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_posix_collate.cpp
# Opt level: O2

void test_char<char>(void)

{
  bool bVar1;
  ostream *poVar2;
  string *name_00;
  long lVar3;
  allocator local_1b2;
  allocator local_1b1;
  locale l;
  generator gen;
  locale l_1;
  string name;
  string names [2];
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  booster::locale::generator::generator(&gen);
  poVar2 = std::operator<<((ostream *)&std::cout,"- Testing at least C");
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::string((string *)names,"en_US.UTF-8",(allocator *)&name);
  booster::locale::generator::generate((string *)&l);
  std::__cxx11::string::~string((string *)names);
  std::__cxx11::string::string((string *)&local_d0,"a",(allocator *)names);
  std::__cxx11::string::string((string *)&local_f0,"b",(allocator *)&name);
  test_one<char>(&l,&local_d0,&local_f0,-1);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::string((string *)&local_110,"a",(allocator *)names);
  std::__cxx11::string::string((string *)&local_130,"a",(allocator *)&name);
  test_one<char>(&l,&local_110,&local_130,0);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_110);
  name._M_dataplus._M_p = (pointer)&name.field_2;
  name._M_string_length = 0;
  name.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)names,"en_US.UTF-8",(allocator *)&l_1);
  std::__cxx11::string::string((string *)(names + 1),"en_US.ISO8859-1",&local_1b2);
  for (lVar3 = 0; lVar3 != 0x40; lVar3 = lVar3 + 0x20) {
    name_00 = (string *)((long)&names[0]._M_dataplus._M_p + lVar3);
    bVar1 = have_locale(name_00);
    if (bVar1) {
      std::__cxx11::string::_M_assign((string *)&name);
      poVar2 = std::operator<<((ostream *)&std::cout,"- Testing ");
      poVar2 = std::operator<<(poVar2,(string *)&name);
      std::endl<char,std::char_traits<char>>(poVar2);
      booster::locale::generator::generate((string *)&l_1);
      std::__cxx11::string::string((string *)&local_b0,"a",&local_1b2);
      std::__cxx11::string::string((string *)&local_50,anon_var_dwarf_3886,&local_1b1);
      test_one<char>(&l_1,&local_b0,&local_50,-1);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::string((string *)&local_70,anon_var_dwarf_3886,&local_1b2);
      std::__cxx11::string::string((string *)&local_90,"d",&local_1b1);
      test_one<char>(&l_1,&local_70,&local_90,-1);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_70);
      std::locale::~locale(&l_1);
    }
    else {
      poVar2 = std::operator<<((ostream *)&std::cout,"- ");
      poVar2 = std::operator<<(poVar2,(string *)name_00);
      poVar2 = std::operator<<(poVar2," not supported, skipping");
      std::endl<char,std::char_traits<char>>(poVar2);
    }
  }
  lVar3 = 0x20;
  do {
    std::__cxx11::string::~string((string *)((long)&names[0]._M_dataplus._M_p + lVar3));
    lVar3 = lVar3 + -0x20;
  } while (lVar3 != -0x20);
  std::__cxx11::string::~string((string *)&name);
  std::locale::~locale(&l);
  booster::locale::generator::~generator(&gen);
  return;
}

Assistant:

void test_char()
{
    booster::locale::generator gen;
    
    std::cout << "- Testing at least C" << std::endl;

    std::locale l = gen("en_US.UTF-8");

    test_one<CharType>(l,"a","b",-1);
    test_one<CharType>(l,"a","a",0);

    std::string name;


    #if !defined(__APPLE__) && !defined(__FreeBSD__)
    std::string names[] = { "en_US.UTF-8", "en_US.ISO8859-1" };
    for(unsigned i=0;i<sizeof(names)/sizeof(names[0]);i++) {
        if(have_locale(names[i])) {
            name = names[i];
            std::cout << "- Testing " << name << std::endl;
            std::locale l=gen(name);
            test_one<CharType>(l,"a","ç",-1);
            test_one<CharType>(l,"ç","d",-1);
        }
        else {
            std::cout << "- " << names[i] << " not supported, skipping" << std::endl;
        }
    }
    #else
    std::cout << "- Collation is broken on this OS C standard library, skipping" << std::endl;
    #endif
}